

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# g_editor_extras.c
# Opt level: O2

void stack_conn(_glist *x,t_object *new,int *newoutlet,t_object *org,int orgoutlet,_outconnect *conn
               )

{
  int *piVar1;
  int index1;
  int index1_00;
  int index2;
  _outconnect *conn_00;
  void *pvVar2;
  int which;
  t_object *dest;
  t_object *local_48;
  int *local_40;
  _inlet *in;
  
  dest = (t_object *)0x0;
  in = (_inlet *)0x0;
  if (conn != (_outconnect *)0x0) {
    conn_00 = obj_nexttraverseoutlet(conn,&dest,&in,&which);
    stack_conn(x,new,newoutlet,org,orgoutlet,conn_00);
    index1 = canvas_getindex(x,&new->te_g);
    index1_00 = canvas_getindex(x,&org->te_g);
    local_40 = newoutlet;
    index2 = canvas_getindex(x,&dest->te_g);
    local_48 = new;
    obj_disconnect(org,orgoutlet,dest,which);
    pvVar2 = canvas_undo_set_disconnect(x,index1_00,orgoutlet,index2,which);
    canvas_undo_add(x,UNDO_DISCONNECT,"disconnect",pvVar2);
    piVar1 = local_40;
    obj_connect(local_48,*local_40,dest,which);
    pvVar2 = canvas_undo_set_connect(x,index1,*piVar1,index2,which);
    canvas_undo_add(x,UNDO_CONNECT,"connect",pvVar2);
    *piVar1 = *piVar1 + 1;
  }
  return;
}

Assistant:

static void stack_conn(t_glist*x, t_object*new, int*newoutlet, t_object*org,
    int orgoutlet, t_outconnect*conn)
{
    t_object*dest=0;
    t_inlet *in =0;
    int which;
    int new_i, org_i, dest_i;
    if(!conn)
        return;
    conn=obj_nexttraverseoutlet(conn, &dest, &in, &which);
    stack_conn(x, new, newoutlet, org, orgoutlet, conn);
    new_i = canvas_getindex(x, o2g(new));
    org_i = canvas_getindex(x, o2g(org));
    dest_i = canvas_getindex(x, o2g(dest));
    obj_disconnect(org, orgoutlet, dest, which);
    canvas_undo_add(x, UNDO_DISCONNECT, "disconnect",
        canvas_undo_set_disconnect(x, org_i, orgoutlet, dest_i, which));
    obj_connect(new, *newoutlet, dest, which);
    canvas_undo_add(x, UNDO_CONNECT, "connect",
        canvas_undo_set_connect(x, new_i, *newoutlet, dest_i, which));
    (*newoutlet)++;
}